

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

Function __thiscall
mp::BasicExprFactory<AllocatorRef<MockAllocator,_char>_>::CreateFunction
          (BasicExprFactory<AllocatorRef<MockAllocator,_char>_> *this,Impl **impl,StringRef name,
          int num_args,Type type)

{
  SafeInt<unsigned_long> SVar1;
  Impl *pIVar2;
  SafeInt<unsigned_long> b;
  size_t size;
  
  b.value_ = name.size_;
  SVar1 = operator+((SafeInt<unsigned_long>)0xc,b);
  pIVar2 = (Impl *)operator_new__(-(ulong)(SVar1.value_ >> 0x3d != 0) | SVar1.value_ * 8);
  pIVar2->type = type;
  pIVar2->num_args = num_args;
  if (b.value_ != 0) {
    memcpy(pIVar2->name,name.data_,b.value_);
  }
  pIVar2->name[b.value_] = '\0';
  *impl = pIVar2;
  return (Function)pIVar2;
}

Assistant:

Function BasicExprFactory<Alloc>::CreateFunction(
    const Function::Impl *&impl, fmt::StringRef name,
    int num_args, func::Type type) {
  /// Function::Impl already has space for terminating null char so
  /// we need to allocate extra size chars only.
  typedef Function::Impl Impl;
  SafeInt<std::size_t> size = sizeof(Impl);
  // Replace by ::new due to #174
  Impl* new_impl = (Impl*) new char* [val(size + name.size())];
  new_impl->type = type;
  new_impl->num_args = num_args;
  this->Copy(name, new_impl->name);
  impl = new_impl;
  return Function(impl);
}